

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderLp.cpp
# Opt level: O2

void __thiscall
FilereaderLp::writeToFileMatrixRow
          (FilereaderLp *this,FILE *file,HighsInt iRow,HighsSparseMatrix *ar_matrix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *col_names)

{
  int var_index;
  pointer pbVar1;
  pointer pbVar2;
  pointer piVar3;
  long lVar4;
  string local_50;
  
  pbVar1 = (col_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (col_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  piVar3 = (ar_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = (long)piVar3[iRow]; lVar4 < piVar3[(long)iRow + 1]; lVar4 = lVar4 + 1) {
    var_index = (ar_matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
    writeToFile(this,file," %+.15g",
                (ar_matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4]);
    if (pbVar2 == pbVar1) {
      writeToFileVar(this,file,var_index);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 ((col_names->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + var_index));
      writeToFileVar(this,file,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    piVar3 = (ar_matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void FilereaderLp::writeToFileMatrixRow(FILE* file, const HighsInt iRow,
                                        const HighsSparseMatrix ar_matrix,
                                        const std::vector<string> col_names) {
  assert(ar_matrix.isRowwise());
  const bool has_col_names = allow_model_names && col_names.size() > 0;

  for (HighsInt iEl = ar_matrix.start_[iRow]; iEl < ar_matrix.start_[iRow + 1];
       iEl++) {
    HighsInt iCol = ar_matrix.index_[iEl];
    double coef = ar_matrix.value_[iEl];
    this->writeToFileValue(file, coef);
    if (has_col_names) {
      this->writeToFileVar(file, col_names[iCol]);
    } else {
      this->writeToFileVar(file, iCol);
    }
  }
}